

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

size_t Base32ToByteStream(char *inBuf,size_t len,uint8_t *outBuf,size_t outLen)

{
  char cVar1;
  int iVar2;
  char ch;
  size_t i;
  size_t ret;
  int bits;
  int tmp;
  size_t outLen_local;
  uint8_t *outBuf_local;
  size_t len_local;
  char *inBuf_local;
  
  tmp = 0;
  bits = 0;
  ret = 0;
  i = 0;
  do {
    if (len <= i) {
      return ret;
    }
    cVar1 = inBuf[i];
    if ((cVar1 < '2') || ('7' < cVar1)) {
      if ((cVar1 < 'a') || ('z' < cVar1)) {
        return 0;
      }
      ch = cVar1 + -0x61;
    }
    else {
      ch = cVar1 + -0x18;
    }
    iVar2 = bits + 5;
    if (7 < iVar2) {
      if (outLen <= ret) {
        return ret;
      }
      outBuf[ret] = (uint8_t)((ch | tmp) >> ((char)iVar2 - 8U & 0x1f));
      ret = ret + 1;
      iVar2 = bits + -3;
    }
    bits = iVar2;
    tmp = (ch | tmp) << 5;
    i = i + 1;
  } while( true );
}

Assistant:

size_t Base32ToByteStream (const char * inBuf, size_t len, uint8_t * outBuf, size_t outLen)
	{
		int tmp = 0, bits = 0;
		size_t ret = 0;
		for (size_t i = 0; i < len; i++)
		{
			char ch = inBuf[i];
			if (ch >= '2' && ch <= '7') // digit
				ch = (ch - '2') + 26; // 26 means a-z
			else if (ch >= 'a' && ch <= 'z')
				ch = ch - 'a'; // a = 0
			else
				return 0; // unexpected character

			tmp |= ch;
			bits += 5;
			if (bits >= 8)
			{
				if (ret >= outLen) return ret;
				outBuf[ret] = tmp >> (bits - 8);
				bits -= 8;
				ret++;
			}
			tmp <<= 5;
		}
		return ret;
	}